

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_table_add_union(flatcc_builder_t *B,int id,flatcc_builder_union_ref_t uref)

{
  flatcc_builder_ref_t *pfVar1;
  flatcc_builder_utype_t *pfVar2;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x60d,
                  "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                 );
  }
  if ((ulong)uref >> 0x20 != 0 && uref.type == '\0') {
    __assert_fail("uref.type != 0 || uref.value == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x60e,
                  "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                 );
  }
  if ((ulong)uref >> 0x20 != 0) {
    pfVar1 = flatcc_builder_table_add_offset(B,id);
    if (pfVar1 == (flatcc_builder_ref_t *)0x0) {
      __assert_fail("pref != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x611,
                    "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                   );
    }
    *pfVar1 = uref.value;
  }
  pfVar2 = (flatcc_builder_utype_t *)flatcc_builder_table_add(B,id + -1,1,1);
  if (pfVar2 != (flatcc_builder_utype_t *)0x0) {
    *pfVar2 = uref.type;
    return 0;
  }
  __assert_fail("putype != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x615,
                "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
               );
}

Assistant:

int flatcc_builder_table_add_union(flatcc_builder_t *B, int id,
    flatcc_builder_union_ref_t uref)
{
    flatcc_builder_ref_t *pref;
    flatcc_builder_utype_t *putype;

    check(frame(type) == flatcc_builder_table, "expected table frame");
    check_error(uref.type != 0 || uref.value == 0, -1, "expected null value for type NONE");
    if (uref.value != 0) {
        pref = flatcc_builder_table_add_offset(B, id);
        check_error(pref != 0, -1, "unable to add union value");
        *pref = uref.value;
    }
    putype = flatcc_builder_table_add(B, id - 1, utype_size, utype_size);
    check_error(putype != 0, -1, "unable to add union type");
    write_utype(putype, uref.type);
    return 0;
}